

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

QLoggingCategory * lcGestureManager(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if (lcGestureManager()::category != '\0') {
    return (QLoggingCategory *)CONCAT71(in_register_00000001,lcGestureManager()::category);
  }
  lcGestureManager();
  return (QLoggingCategory *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

static inline int panTouchPoints()
{
    // Override by environment variable for testing.
    static const char panTouchPointVariable[] = "QT_PAN_TOUCHPOINTS";
    if (qEnvironmentVariableIsSet(panTouchPointVariable)) {
        bool ok;
        const int result = qEnvironmentVariableIntValue(panTouchPointVariable, &ok);
        if (ok && result >= 1)
            return result;
        qWarning("Ignoring invalid value of %s", panTouchPointVariable);
    }
    // Pan should use 1 finger on a touch screen and 2 fingers on touch pads etc.
    // where 1 finger movements are used for mouse event synthetization. For now,
    // default to 2 until all classes inheriting QScrollArea are fixed to handle it
    // correctly.
    return 2;
}